

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O0

ze_result_t loader::zesPerformanceFactorGetConfig(zes_perf_handle_t hPerf,double *pFactor)

{
  zes_pfnPerformanceFactorGetConfig_t pfnGetConfig;
  dditable_t *dditable;
  ze_result_t result;
  double *pFactor_local;
  zes_perf_handle_t hPerf_local;
  
  if (*(code **)(*(long *)(hPerf + 8) + 0xa88) == (code *)0x0) {
    hPerf_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hPerf_local._4_4_ = (**(code **)(*(long *)(hPerf + 8) + 0xa88))(*(undefined8 *)hPerf,pFactor);
  }
  return hPerf_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesPerformanceFactorGetConfig(
        zes_perf_handle_t hPerf,                        ///< [in] Handle for the Performance Factor domain.
        double* pFactor                                 ///< [in,out] Will contain the actual Performance Factor being used by the
                                                        ///< hardware (may not be the same as the requested Performance Factor).
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_perf_object_t*>( hPerf )->dditable;
        auto pfnGetConfig = dditable->zes.PerformanceFactor.pfnGetConfig;
        if( nullptr == pfnGetConfig )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hPerf = reinterpret_cast<zes_perf_object_t*>( hPerf )->handle;

        // forward to device-driver
        result = pfnGetConfig( hPerf, pFactor );

        return result;
    }